

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O1

size_t io::net::
       read_until<io::basic_string_stream<char,std::char_traits<char>>,io::net::dynamic_vector_buffer<char,std::allocator<char>>>
                 (basic_string_stream<char,_std::char_traits<char>_> *s,
                 dynamic_vector_buffer<char,_std::allocator<char>_> *b,char delim)

{
  size_t sVar1;
  system_error *this;
  error_code *in_R9;
  string_view delim_00;
  error_code __ec;
  error_code ec;
  char local_31;
  uint local_30 [2];
  error_category *local_28;
  
  local_30[0] = 0;
  local_28 = (error_category *)std::_V2::system_category();
  delim_00._M_str = (char *)local_30;
  delim_00._M_len = (size_t)&local_31;
  local_31 = delim;
  sVar1 = read_until<io::basic_string_stream<char,std::char_traits<char>>,io::net::dynamic_vector_buffer<char,std::allocator<char>>>
                    ((net *)s,(basic_string_stream<char,_std::char_traits<char>_> *)b,
                     (dynamic_vector_buffer<char,_std::allocator<char>_> *)0x1,delim_00,in_R9);
  if (local_30[0] == 0) {
    return sVar1;
  }
  this = (system_error *)__cxa_allocate_exception(0x20);
  __ec._4_4_ = 0;
  __ec._M_value = local_30[0];
  __ec._M_cat = local_28;
  std::system_error::system_error(this,__ec);
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

std::size_t read_until(SyncReadStream& s, DynamicBuffer&& b, char delim)
{
    std::error_code ec;
    std::size_t bytes_read = read_until(s, std::forward<DynamicBuffer>(b),
                                        delim, ec);
    if (ec) {
        throw std::system_error{ec};
    }
    return bytes_read;
}